

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

MergeResult
mergesort_cache_lcp_2way<true,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  uchar uVar1;
  ostream *poVar2;
  lcp_t lVar3;
  ulong n_00;
  MergeResult local_68;
  MergeResult local_64;
  MergeResult m1;
  MergeResult m0;
  size_t split0;
  uint i;
  uchar *cache_output_local;
  uchar *cache_input_local;
  lcp_t *lcp_output_local;
  lcp_t *lcp_input_local;
  uchar **strings_output_local;
  uchar **strings_input_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"mergesort_cache_lcp_2way");
  poVar2 = std::operator<<(poVar2,"(): n=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
  std::operator<<(poVar2,'\n');
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,0);
    lVar3 = lcp(*strings_input,strings_input[1]);
    *lcp_input = lVar3;
    uVar1 = get_char<unsigned_char>(*strings_input,0);
    *cache_input = uVar1;
    for (split0._4_4_ = 1; (ulong)split0._4_4_ < n - 1; split0._4_4_ = split0._4_4_ + 1) {
      lVar3 = lcp(strings_input[split0._4_4_],strings_input[split0._4_4_ + 1]);
      lcp_input[split0._4_4_] = lVar3;
      uVar1 = get_char<unsigned_char>(strings_input[split0._4_4_],lcp_input[split0._4_4_ - 1]);
      cache_input[split0._4_4_] = uVar1;
    }
    uVar1 = get_char<unsigned_char>(strings_input[n - 1],lcp_input[n - 2]);
    cache_input[n - 1] = uVar1;
    check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
    strings_input_local._4_4_ = SortedInPlace;
  }
  else {
    n_00 = n >> 1;
    local_64 = mergesort_cache_lcp_2way<true,unsigned_char>
                         (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output
                          ,n_00);
    if (local_64 == SortedInPlace) {
      check_input<unsigned_char>(strings_input,lcp_input,cache_input,n_00);
    }
    else {
      check_input<unsigned_char>(strings_output,lcp_output,cache_output,n_00);
    }
    local_68 = mergesort_cache_lcp_2way<true,unsigned_char>
                         (strings_input + n_00,strings_output + n_00,lcp_input + n_00,
                          lcp_output + n_00,cache_input + n_00,cache_output + n_00,n - n_00);
    if (local_64 == SortedInPlace) {
      check_input<unsigned_char>(strings_input + n_00,lcp_input + n_00,cache_input + n_00,n - n_00);
    }
    else {
      check_input<unsigned_char>
                (strings_output + n_00,lcp_output + n_00,cache_output + n_00,n - n_00);
    }
    if (local_64 != local_68) {
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar2 = std::operator<<(poVar2,"Warning: extra copying due to m0 != m1. n=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
      std::operator<<(poVar2,"\n");
      if (local_64 == SortedInPlace) {
        std::copy<unsigned_char**,unsigned_char**>
                  (strings_input,strings_input + n_00,strings_output);
        std::copy<unsigned_char*,unsigned_char*>(cache_input,cache_input + n_00,cache_output);
        std::copy<unsigned_long*,unsigned_long*>(lcp_input,lcp_input + n_00,lcp_output);
        local_64 = SortedInTemp;
      }
      else {
        std::copy<unsigned_char**,unsigned_char**>
                  (strings_output,strings_output + n_00,strings_input);
        std::copy<unsigned_char*,unsigned_char*>(cache_output,cache_output + n_00,cache_input);
        std::copy<unsigned_long*,unsigned_long*>(lcp_output,lcp_output + n_00,lcp_input);
        local_68 = SortedInTemp;
      }
    }
    if (local_64 != local_68) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x56e,
                    "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    if (local_64 == SortedInPlace) {
      merge_cache_lcp_2way<true,unsigned_char>
                (strings_input,lcp_input,cache_input,n_00,strings_input + n_00,lcp_input + n_00,
                 cache_input + n_00,n - n_00,strings_output,lcp_output,cache_output);
      strings_input_local._4_4_ = SortedInTemp;
    }
    else {
      merge_cache_lcp_2way<true,unsigned_char>
                (strings_output,lcp_output,cache_output,n_00,strings_output + n_00,lcp_output + n_00
                 ,cache_output + n_00,n - n_00,strings_input,lcp_input,cache_input);
      strings_input_local._4_4_ = SortedInPlace;
    }
  }
  return strings_input_local._4_4_;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}